

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O1

void sndio_stream_destroy(cubeb_stream_conflict2 *s)

{
  (*cubeb_sio_close)(s->hdl);
  if ((s->mode & 1) != 0) {
    free(s->pbuf);
  }
  if ((s->mode & 2) != 0) {
    free(s->rbuf);
  }
  free(s);
  return;
}

Assistant:

static void
sndio_stream_destroy(cubeb_stream * s)
{
  DPR("sndio_stream_destroy()\n");
  WRAP(sio_close)(s->hdl);
  if (s->mode & SIO_PLAY)
    free(s->pbuf);
  if (s->mode & SIO_REC)
    free(s->rbuf);
  free(s);
}